

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
SimpleParallelSimulationDataGenerator::GenerateSimulationData
          (SimpleParallelSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  pointer ppSVar1;
  pointer ppSVar2;
  U32 UVar3;
  ulong uVar4;
  ulong uVar5;
  SimulationChannelDescriptor *pSVar6;
  uint uVar7;
  
  uVar4 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar7 = (int)this + 0x10;
  while( true ) {
    uVar5 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar4 <= uVar5) break;
    SimulationChannelDescriptorGroup::AdvanceAll(uVar7);
    ppSVar1 = (this->mData).
              super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppSVar2 = (this->mData).
              super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar5 = 0; ((ulong)((long)ppSVar1 - (long)ppSVar2) >> 3 & 0xffffffff) != uVar5;
        uVar5 = uVar5 + 1) {
      SimulationChannelDescriptor::TransitionIfNeeded
                ((BitState)
                 (this->mData).
                 super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5]);
    }
    if (this->mSettings->mClockEdge != DualEdge) {
      SimulationChannelDescriptor::Transition();
    }
    SimulationChannelDescriptorGroup::AdvanceAll(uVar7);
    SimulationChannelDescriptor::Transition();
    this->mValue = this->mValue + 1;
  }
  pSVar6 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channel = pSVar6;
  UVar3 = SimulationChannelDescriptorGroup::GetCount();
  return UVar3;
}

Assistant:

U32 SimpleParallelSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                                   SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mClock->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        mSimulationData.AdvanceAll( 1000 );
        U32 count = mData.size();
        for( U32 i = 0; i < count; i++ )
        {
            if( ( mDataMasks[ i ] & mValue ) == 0 )
                mData[ i ]->TransitionIfNeeded( BIT_LOW );
            else
                mData[ i ]->TransitionIfNeeded( BIT_HIGH );
        }
        if( mSettings->mClockEdge != ParallelAnalyzerClockEdge::DualEdge )
        {
            mClock->Transition();
        }

        mSimulationData.AdvanceAll( 1000 );
        mClock->Transition();

        mValue++;
    }

    *simulation_channel = mSimulationData.GetArray();
    return mSimulationData.GetCount();
}